

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

void __thiscall
wallet::coinselector_tests::wallet_coinsresult_test::test_method(wallet_coinsresult_test *this)

{
  bool bVar1;
  CAmount *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<COutPoint,_true,_false>,_bool> pVar2;
  int in_stack_00000070;
  int in_stack_00000080;
  COutPoint *out;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *__range2;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *updated_coins;
  int i_1;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *coins;
  int i;
  __normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  it;
  iterator __end2;
  iterator __begin2;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  outs_to_remove;
  unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> dummyWallet;
  CoinsResult available_coins;
  char *in_stack_fffffffffffffcf8;
  CoinsResult *in_stack_fffffffffffffd00;
  assertion_result *in_stack_fffffffffffffd08;
  CoinsResult *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  anon_class_8_1_ba1d6aae_for__M_pred in_stack_fffffffffffffd28;
  __normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  in_stack_fffffffffffffd30;
  __normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
  in_stack_fffffffffffffd38;
  unit_test_log_t *this_00;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *in_stack_fffffffffffffd50;
  CoinsResult *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  NodeContext *in_stack_fffffffffffffd68;
  int local_234;
  int local_228;
  undefined1 in_stack_fffffffffffffde2;
  undefined1 in_stack_fffffffffffffde3;
  int in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  CoinsResult *in_stack_fffffffffffffdf8;
  undefined1 local_200 [8];
  const_string local_1b0 [2];
  lazy_ostream local_190;
  CFeeRate in_stack_fffffffffffffe80;
  assertion_result local_168 [2];
  COutput *local_130;
  _Node_iterator_base<COutPoint,_false> local_128;
  _Node_iterator_base<COutPoint,_false> local_120;
  undefined8 local_98;
  allocator<char> local_89 [9];
  _Node_iterator_base<COutPoint,_false> local_80;
  undefined1 local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CoinsResult::CoinsResult(in_stack_fffffffffffffd00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd48,
             (char *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
             (allocator<char> *)in_stack_fffffffffffffd38._M_current);
  NewWallet(in_stack_fffffffffffffd68,
            (string *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf8);
  std::allocator<char>::~allocator(local_89);
  for (local_228 = 0; local_228 < 10; local_228 = local_228 + 1) {
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_fffffffffffffd08);
    local_98 = 100000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffcf8,0);
    in_stack_fffffffffffffd08 =
         (assertion_result *)((ulong)in_stack_fffffffffffffd08 & 0xffffffff00000000);
    in_stack_fffffffffffffd00 =
         (CoinsResult *)((ulong)in_stack_fffffffffffffd00 & 0xffffffff00000000);
    in_stack_fffffffffffffcf8 = (char *)((ulong)in_stack_fffffffffffffcf8 & 0xffffffff00000000);
    add_coin(in_stack_fffffffffffffdf8,
             (CWallet *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),in_RDI,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffde4,(bool)in_stack_fffffffffffffde3,
             in_stack_00000070,(bool)in_stack_fffffffffffffde2,in_stack_00000080);
  }
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffd08);
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::unordered_set((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                   *)in_stack_fffffffffffffcf8);
  CoinsResult::All((CoinsResult *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  for (local_234 = 0; local_234 < 2; local_234 = local_234 + 1) {
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::operator[]
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_fffffffffffffd08,(size_type)in_stack_fffffffffffffd00);
    pVar2 = std::
            unordered_set<COutPoint,SaltedOutpointHasher,std::equal_to<COutPoint>,std::allocator<COutPoint>>
            ::emplace<COutPoint_const&>
                      ((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                        *)in_stack_fffffffffffffd08,(COutPoint *)in_stack_fffffffffffffd00);
    local_80._M_cur = (__node_type *)pVar2.first.super__Node_iterator_base<COutPoint,_false>._M_cur;
    in_stack_fffffffffffffd67 = pVar2.second;
    local_78 = in_stack_fffffffffffffd67;
  }
  CoinsResult::Erase(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  CoinsResult::All((CoinsResult *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  local_120._M_cur =
       (__node_type *)
       std::
       unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
       ::begin((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                *)in_stack_fffffffffffffd00);
  local_128._M_cur =
       (__node_type *)
       std::
       unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
       ::end((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
              *)in_stack_fffffffffffffd00);
  while (bVar1 = std::__detail::operator==
                           ((_Node_iterator_base<COutPoint,_false> *)in_stack_fffffffffffffd08,
                            (_Node_iterator_base<COutPoint,_false> *)in_stack_fffffffffffffd00),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::_Node_iterator<COutPoint,_true,_false>::operator*
              ((_Node_iterator<COutPoint,_true,_false> *)in_stack_fffffffffffffcf8);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::begin
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_fffffffffffffd00);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::end
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
               in_stack_fffffffffffffd00);
    local_130 = (COutput *)
                std::
                find_if<__gnu_cxx::__normal_iterator<wallet::COutput_const*,std::vector<wallet::COutput,std::allocator<wallet::COutput>>>,wallet::coinselector_tests::wallet_coinsresult_test::test_method()::__0>
                          (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                           in_stack_fffffffffffffd28);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffd38._M_current,
                 (const_string *)in_stack_fffffffffffffd30._M_current,
                 (size_t)in_stack_fffffffffffffd28.out,
                 (const_string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::end
                ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                 in_stack_fffffffffffffd00);
      __gnu_cxx::
      operator==<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                ((__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                  *)in_stack_fffffffffffffd08,
                 (__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                  *)in_stack_fffffffffffffd00);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffd08,SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffd00,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
                 (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
      in_stack_fffffffffffffcf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_168,&local_190,local_1b0,0x630,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffcf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffcf8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::__detail::_Node_iterator<COutPoint,_true,_false>::operator++
              ((_Node_iterator<COutPoint,_true,_false> *)in_stack_fffffffffffffcf8);
  }
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)in_stack_fffffffffffffd30._M_current,
               (size_t)in_stack_fffffffffffffd28.out,
               (const_string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    in_stack_fffffffffffffd30._M_current = (COutput *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd00,(char (*) [1])in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd28.out = (COutPoint *)CoinsResult::Size(in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd08 = (assertion_result *)0x1e9b1ad;
    in_stack_fffffffffffffd00 = (CoinsResult *)&stack0xfffffffffffffdf4;
    in_stack_fffffffffffffcf8 = "available_coins.Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&stack0xfffffffffffffe10,local_200,0x633,1,2,&stack0xfffffffffffffdf8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd27);
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
            ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)in_stack_fffffffffffffd08)
  ;
  std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::~vector
            ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)in_stack_fffffffffffffd08)
  ;
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::~unordered_set((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                    *)in_stack_fffffffffffffcf8);
  CoinsResult::~CoinsResult((CoinsResult *)in_stack_fffffffffffffcf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_coinsresult_test, BasicTestingSetup)
{
    // Test case to verify CoinsResult object sanity.
    CoinsResult available_coins;
    {
        std::unique_ptr<CWallet> dummyWallet = NewWallet(m_node, /*wallet_name=*/"dummy");

        // Add some coins to 'available_coins'
        for (int i=0; i<10; i++) {
            add_coin(available_coins, *dummyWallet, 1 * COIN);
        }
    }

    {
        // First test case, check that 'CoinsResult::Erase' function works as expected.
        // By trying to erase two elements from the 'available_coins' object.
        std::unordered_set<COutPoint, SaltedOutpointHasher> outs_to_remove;
        const auto& coins = available_coins.All();
        for (int i = 0; i < 2; i++) {
            outs_to_remove.emplace(coins[i].outpoint);
        }
        available_coins.Erase(outs_to_remove);

        // Check that the elements were actually removed.
        const auto& updated_coins = available_coins.All();
        for (const auto& out: outs_to_remove) {
            auto it = std::find_if(updated_coins.begin(), updated_coins.end(), [&out](const COutput &coin) {
                return coin.outpoint == out;
            });
            BOOST_CHECK(it == updated_coins.end());
        }
        // And verify that no extra element were removed
        BOOST_CHECK_EQUAL(available_coins.Size(), 8);
    }
}